

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# built_in_functions.cpp
# Opt level: O2

void __thiscall
duckdb::BuiltinFunctions::AddFunction(BuiltinFunctions *this,AggregateFunctionSet *set)

{
  CreateAggregateFunctionInfo info;
  FunctionSet<duckdb::AggregateFunction> local_200;
  CreateAggregateFunctionInfo local_1c8;
  
  FunctionSet<duckdb::AggregateFunction>::FunctionSet
            (&local_200,&set->super_FunctionSet<duckdb::AggregateFunction>);
  CreateAggregateFunctionInfo::CreateAggregateFunctionInfo
            (&local_1c8,(AggregateFunctionSet *)&local_200);
  FunctionSet<duckdb::AggregateFunction>::~FunctionSet(&local_200);
  local_1c8.super_CreateFunctionInfo.super_CreateInfo.internal = true;
  Catalog::CreateFunction(this->catalog,this->transaction,&local_1c8.super_CreateFunctionInfo);
  CreateAggregateFunctionInfo::~CreateAggregateFunctionInfo(&local_1c8);
  return;
}

Assistant:

void BuiltinFunctions::AddFunction(AggregateFunctionSet set) {
	CreateAggregateFunctionInfo info(std::move(set));
	info.internal = true;
	catalog.CreateFunction(transaction, info);
}